

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O3

bool __thiscall Security::EncodeOpnd(Security *this,Instr *instr,Opnd *opnd)

{
  int iVar1;
  long lVar2;
  Func *func;
  long lVar3;
  Opnd *this_00;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  bool bVar7;
  int32 iVar8;
  RegOpnd *in_RAX;
  undefined4 *puVar9;
  UINT_PTR UVar10;
  IntConstOpnd *pIVar11;
  IndirOpnd *src;
  IntConstType value;
  Var address;
  _func_int **pp_Var12;
  RegOpnd *pRVar13;
  RegOpnd *local_38;
  
  local_38 = in_RAX;
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar5 == OpndKindIndir) {
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar6) goto LAB_00623915;
      *puVar9 = 0;
    }
    if ((((Opnd *)opnd[1]._vptr_Opnd == (Opnd *)0x0) ||
        (lVar2._0_2_ = opnd[1].m_valueType, lVar2._2_1_ = opnd[1].m_type,
        lVar2._3_1_ = opnd[1].field_0xb, lVar2._4_1_ = opnd[1].m_kind,
        lVar2._5_1_ = opnd[1].isDeleted, lVar2._6_2_ = *(undefined2 *)&opnd[1].field_0xe, lVar2 != 0
        )) || ((int)(short)*(int *)&opnd[2]._vptr_Opnd != *(int *)&opnd[2]._vptr_Opnd)) {
      pIVar11 = IR::IntConstOpnd::New((long)*(int *)&opnd[2]._vptr_Opnd,TyInt64,instr->m_func,false)
      ;
      value = EncodeValue(this,instr,&pIVar11->super_Opnd,
                          (pIVar11->super_EncodableOpnd<long>).m_value,&local_38);
      IR::IntConstOpnd::SetValue(pIVar11,value);
      *(undefined4 *)&opnd[2]._vptr_Opnd = 0;
      opnd->field_0xe = 0;
      lVar3._0_2_ = opnd[1].m_valueType;
      lVar3._2_1_ = opnd[1].m_type;
      lVar3._3_1_ = opnd[1].field_0xb;
      lVar3._4_1_ = opnd[1].m_kind;
      lVar3._5_1_ = opnd[1].isDeleted;
      lVar3._6_2_ = *(undefined2 *)&opnd[1].field_0xe;
      if (lVar3 == 0) {
        IR::IndirOpnd::SetIndexOpnd((IndirOpnd *)opnd,local_38);
        return true;
      }
      if (opnd[1]._vptr_Opnd != (_func_int **)0x0) {
        pRVar13 = IR::RegOpnd::New(TyInt64,instr->m_func);
        Lowerer::InsertAdd(false,&pRVar13->super_Opnd,&local_38->super_Opnd,
                           (Opnd *)opnd[1]._vptr_Opnd,instr);
        IR::IndirOpnd::ReplaceBaseOpnd((IndirOpnd *)opnd,pRVar13);
        return true;
      }
    }
    else {
      if ((this->baseOpnd == (RegOpnd *)0x0) ||
         (bVar6 = IR::Opnd::IsEqual(&this->baseOpnd->super_Opnd,(Opnd *)opnd[1]._vptr_Opnd), !bVar6)
         ) {
        if (this->cookieOpnd != (IntConstOpnd *)0x0) {
          IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
        }
        func = instr->m_func;
        UVar10 = Math::Rand();
        pIVar11 = IR::IntConstOpnd::New((long)(short)UVar10,TyInt16,func,false);
        (pIVar11->super_EncodableOpnd<long>).name = L"cookie";
        this->cookieOpnd = pIVar11;
        pRVar13 = IR::RegOpnd::New(TyInt64,instr->m_func);
        this->basePlusCookieOpnd = pRVar13;
        pRVar13 = (RegOpnd *)opnd[1]._vptr_Opnd;
        this->baseOpnd = pRVar13;
        iVar8 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
        src = IR::IndirOpnd::New(pRVar13,iVar8,TyInt64,instr->m_func,false);
        Lowerer::InsertLea(this->basePlusCookieOpnd,&src->super_Opnd,instr);
      }
      iVar1 = *(int *)&opnd[2]._vptr_Opnd;
      iVar8 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
      *(int *)&opnd[2]._vptr_Opnd = iVar1 - iVar8;
      opnd->field_0xe = 0;
      local_38 = this->basePlusCookieOpnd;
    }
    IR::IndirOpnd::SetBaseOpnd((IndirOpnd *)opnd,local_38);
  }
  else {
    if (OVar5 == OpndKindAddr) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar6) goto LAB_00623915;
        *puVar9 = 0;
      }
      bVar6 = instr->m_src1 == opnd;
      if (bVar6) {
        IR::Instr::UnlinkSrc1(instr);
      }
      else {
        if (instr->m_src2 != opnd) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                             ,0x16b,"(opnd == instr->GetSrc2())","opnd == instr->GetSrc2()");
          if (!bVar7) goto LAB_00623915;
          *puVar9 = 0;
        }
        IR::Instr::UnlinkSrc2(instr);
      }
      address = (Var)EncodeValue(this,instr,opnd,(IntConstType)opnd[2]._vptr_Opnd,&local_38);
      IR::AddrOpnd::SetEncodedValue
                ((AddrOpnd *)opnd,address,
                 *(AddrOpndKind *)((long)&opnd[2].m_valueType.field_0.bits + 1));
    }
    else {
      if (OVar5 != OpndKindIntConst) {
        return false;
      }
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_00623915;
        *puVar9 = 0;
      }
      bVar6 = instr->m_src1 == opnd;
      if (bVar6) {
        IR::Instr::UnlinkSrc1(instr);
      }
      else {
        if (instr->m_src2 != opnd) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                             ,0x16b,"(opnd == instr->GetSrc2())","opnd == instr->GetSrc2()");
          if (!bVar7) goto LAB_00623915;
          *puVar9 = 0;
        }
        IR::Instr::UnlinkSrc2(instr);
      }
      pp_Var12 = (_func_int **)
                 EncodeValue(this,instr,opnd,(IntConstType)opnd[1]._vptr_Opnd,&local_38);
      *(_func_int ***)&opnd[1].m_valueType = opnd[1]._vptr_Opnd;
      opnd[1]._vptr_Opnd = pp_Var12;
    }
    this_00 = instr->m_dst;
    pRVar13 = local_38;
    if (this_00 != (Opnd *)0x0) {
      pRVar13 = (RegOpnd *)
                IR::Opnd::UseWithNewType(&local_38->super_Opnd,this_00->m_type,instr->m_func);
      OVar5 = IR::Opnd::GetKind(this_00);
      if (OVar5 == OpndKindReg) {
        OVar5 = IR::Opnd::GetKind(this_00);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar7) {
LAB_00623915:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        if (this_00[1]._vptr_Opnd != (_func_int **)0x0) {
          pp_Var12 = this_00[1]._vptr_Opnd + 3;
          *(uint *)pp_Var12 = *(uint *)pp_Var12 & 0xfffffe47;
        }
      }
    }
    LowererMD::ImmedSrcToReg(instr,&pRVar13->super_Opnd,!bVar6 + 1);
  }
  return true;
}

Assistant:

bool
Security::EncodeOpnd(IR::Instr * instr, IR::Opnd *opnd)
{
    IR::RegOpnd *newOpnd;
    bool isSrc2 = false;

    const auto unlinkSrc = [&]() {
        if (opnd != instr->GetSrc1())
        {
            Assert(opnd == instr->GetSrc2());
            isSrc2 = true;
            instr->UnlinkSrc2();
        }
        else
        {
            instr->UnlinkSrc1();
        }
    };

    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();

        unlinkSrc();

        intConstOpnd->SetEncodedValue(EncodeValue(instr, intConstOpnd, intConstOpnd->GetValue(), &newOpnd));
    }
    break;

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();

        unlinkSrc();

        addrOpnd->SetEncodedValue((Js::Var)this->EncodeValue(instr, addrOpnd, (IntConstType)addrOpnd->m_address, &newOpnd), addrOpnd->GetAddrOpndKind());
    }
    break;

    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();

        // Using 32 bit cookie causes major perf loss on the subsequent indirs, so only support this path for 16 bit offset
        // It's relatively rare for base to be null or to have index + offset, so fall back to the more generic xor method for these
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetIndexOpnd() == nullptr && Math::FitsInWord(indirOpnd->GetOffset()))
        {
            if (!this->baseOpnd || !this->baseOpnd->IsEqual(indirOpnd->GetBaseOpnd()))
            {
                if (this->cookieOpnd != nullptr)
                {
                    this->cookieOpnd->Free(this->func);
                }
                this->cookieOpnd = BuildCookieOpnd(TyInt16, instr->m_func);
                this->basePlusCookieOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                this->baseOpnd = indirOpnd->GetBaseOpnd();
                IR::IndirOpnd * indir = IR::IndirOpnd::New(this->baseOpnd, this->cookieOpnd->AsInt32(), TyMachReg, instr->m_func);
                Lowerer::InsertLea(this->basePlusCookieOpnd, indir, instr);
            }
            int32 diff = indirOpnd->GetOffset() - this->cookieOpnd->AsInt32();
            indirOpnd->SetOffset((int32)diff);
            indirOpnd->SetBaseOpnd(this->basePlusCookieOpnd);
            return true;
        }

        IR::IntConstOpnd *indexOpnd = IR::IntConstOpnd::New(indirOpnd->GetOffset(), TyMachReg, instr->m_func);

        indexOpnd->SetValue(EncodeValue(instr, indexOpnd, indexOpnd->GetValue(), &newOpnd));

        indirOpnd->SetOffset(0);
        if (indirOpnd->GetIndexOpnd() != nullptr)
        {
            // update the base rather than the index, because index might have scale
            if (indirOpnd->GetBaseOpnd() != nullptr)
            {
                IR::RegOpnd * newBaseOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                Lowerer::InsertAdd(false, newBaseOpnd, newOpnd, indirOpnd->GetBaseOpnd(), instr);
                indirOpnd->ReplaceBaseOpnd(newBaseOpnd);
            }
            else
            {
                indirOpnd->SetBaseOpnd(newOpnd);
            }
        }
        else
        {
            indirOpnd->SetIndexOpnd(newOpnd);
        }
    }
    return true;

    default:
        return false;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst)
    {
#if TARGET_64
        // Ensure the left and right operand has the same type (that might not be true for constants on x64)
        newOpnd = (IR::RegOpnd *)newOpnd->UseWithNewType(dst->GetType(), instr->m_func);
#endif
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            StackSym *dstSym = dstRegOpnd->m_sym;

            if (dstSym)
            {
                dstSym->m_isConst = false;
                dstSym->m_isIntConst = false;
                dstSym->m_isInt64Const = false;
                dstSym->m_isTaggableIntConst = false;
                dstSym->m_isFltConst = false;
            }
        }
    }

    LowererMD::ImmedSrcToReg(instr, newOpnd, isSrc2 ? 2 : 1);
    return true;
}